

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# srv_state.hxx
# Opt level: O2

ptr<srv_state> __thiscall nuraft::srv_state::deserialize_v1p(srv_state *this,buffer *buf)

{
  shared_ptr<nuraft::srv_state> sVar1;
  ptr<srv_state> pVar2;
  bool et_allowed;
  int voted_for;
  ulong term;
  buffer_serializer bs;
  int32_t local_44;
  uint64_t local_40;
  buffer_serializer local_38;
  
  buffer_serializer::buffer_serializer(&local_38,buf,LITTLE);
  buffer_serializer::get_u8(&local_38);
  local_40 = buffer_serializer::get_u64(&local_38);
  local_44 = buffer_serializer::get_i32(&local_38);
  buffer_serializer::get_u8(&local_38);
  sVar1 = std::make_shared<nuraft::srv_state,unsigned_long&,int&,bool&>
                    ((unsigned_long *)this,(int *)&local_40,(bool *)&local_44);
  pVar2.super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
       sVar1.super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  pVar2.super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (ptr<srv_state>)pVar2.super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static ptr<srv_state> deserialize_v1p(buffer& buf) {
        buffer_serializer bs(buf);
        uint8_t ver = bs.get_u8();
        (void)ver;
        ulong term = bs.get_u64();
        int voted_for = bs.get_i32();
        bool et_allowed = (bs.get_u8() == 1);
        return cs_new<srv_state>(term, voted_for, et_allowed);
    }